

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS
ref_gather_scalar_cell_solb(REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char *filename)

{
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  bool bVar1;
  REF_CELL pRVar2;
  REF_LONG RVar3;
  uint uVar4;
  REF_STATUS RVar5;
  FILE *pFVar6;
  long lVar7;
  size_t sVar8;
  void *pvVar9;
  ulong uVar10;
  undefined8 uVar11;
  REF_CELL *ppRVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  undefined4 uVar21;
  REF_GRID pRVar22;
  REF_CELL ref_cell;
  double dVar23;
  size_t sStackY_160;
  REF_INT part;
  FILE *local_138;
  REF_CELL local_130;
  int keyword_code;
  int local_124;
  REF_GRID local_120;
  void *local_118;
  ulong local_110;
  REF_LONG ncell_local;
  int version;
  size_t local_f8;
  REF_NODE local_f0;
  REF_DBL *local_e8;
  REF_LONG ncell_recv;
  REF_LONG npri;
  REF_LONG ntet;
  REF_LONG ncell;
  double local_c0;
  REF_INT ncell_int;
  int dim;
  int code;
  REF_INT nodes [27];
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  local_130 = (REF_CELL)filename;
  uVar4 = ref_node_synchronize_globals(ref_node);
  pRVar2 = local_130;
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xc5f,
           "ref_gather_scalar_cell_solb",(ulong)uVar4,"sync");
    return uVar4;
  }
  local_e8 = scalar;
  uVar4 = ref_cell_ncell(ref_grid->cell[8],ref_node,&ntet);
  if (uVar4 != 0) {
    uVar18 = (ulong)uVar4;
    pcVar20 = "ntet";
    uVar11 = 0xc61;
    goto LAB_00145ace;
  }
  uVar4 = ref_cell_ncell(ref_grid->cell[10],ref_node,&npri);
  if (uVar4 != 0) {
    uVar18 = (ulong)uVar4;
    pcVar20 = "npri";
    uVar11 = 0xc62;
    goto LAB_00145ace;
  }
  local_120 = ref_grid;
  local_f0 = ref_node;
  if (ntet < 1 || npri != 0) {
    if (ntet != 0 || npri < 1) {
      pcVar20 = "grid must be all tet or all prism";
      uVar11 = 0xc6e;
LAB_00145cc2:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar11,"ref_gather_scalar_cell_solb",pcVar20);
      return 1;
    }
    ppRVar12 = ref_grid->cell + 10;
    uVar21 = 0x43;
  }
  else {
    ppRVar12 = ref_grid->cell + 8;
    uVar21 = 0x42;
  }
  ref_cell = *ppRVar12;
  if (ref_grid->mpi->id == 0) {
    pFVar6 = fopen((char *)pRVar2,"w");
    if (pFVar6 == (FILE *)0x0) {
      RVar5 = 2;
      printf("unable to open %s\n",pRVar2);
      pcVar20 = "unable to open file";
      uVar11 = 0xc74;
      goto LAB_00145ee8;
    }
  }
  else {
    pFVar6 = (FILE *)0x0;
  }
  bVar1 = 10000000 < npri + ntet;
  version = bVar1 + 2;
  local_110 = (ulong)bVar1 * 4 + 0xc;
  iVar14 = 0;
  if (ref_mpi->id == 0) {
    code = 1;
    sVar8 = fwrite(&code,4,1,pFVar6);
    if (sVar8 != 1) {
      pcVar20 = "code";
      sStackY_160 = 1;
      uVar11 = 0xc81;
      goto LAB_00145f1d;
    }
    sVar8 = fwrite(&version,4,1,pFVar6);
    if (sVar8 != 1) {
      pcVar20 = "version";
      sStackY_160 = 1;
      uVar11 = 0xc82;
      goto LAB_00145f1d;
    }
    local_118 = (void *)CONCAT44(local_118._4_4_,uVar21);
    local_130 = ref_cell;
    lVar13 = ftell(pFVar6);
    keyword_code = 3;
    sVar8 = fwrite(&keyword_code,4,1,pFVar6);
    iVar15 = version;
    if (sVar8 != 1) {
      pcVar20 = "dim code";
      sStackY_160 = 1;
      uVar11 = 0xc85;
      goto LAB_00145f1d;
    }
    sVar8 = lVar13 + local_110;
    local_138 = pFVar6;
    uVar4 = ref_export_meshb_next_position((FILE *)pFVar6,version,sVar8);
    pFVar6 = local_138;
    if (uVar4 != 0) {
      uVar18 = (ulong)uVar4;
      pcVar20 = "next p";
      uVar11 = 0xc86;
      goto LAB_00145ace;
    }
    dim = 3;
    local_f8 = sVar8;
    sVar8 = fwrite(&dim,4,1,local_138);
    if (sVar8 != 1) {
      pcVar20 = "dim";
      sStackY_160 = 1;
      uVar11 = 0xc88;
      goto LAB_00145f1d;
    }
    sVar8 = ftell(pFVar6);
    if (local_f8 != sVar8) {
      pcVar20 = "dim inconsistent";
      uVar11 = 0xc89;
      sStackY_160 = local_f8;
      goto LAB_00145f1d;
    }
    local_124 = iVar15;
    ref_cell = local_130;
  }
  else {
    local_118 = (void *)CONCAT44(local_118._4_4_,uVar21);
    local_f8 = 0;
    local_138 = pFVar6;
    local_124 = version;
  }
  ncell_local = 0;
  for (; iVar14 < ref_cell->max; iVar14 = iVar14 + 1) {
    RVar5 = ref_cell_nodes(ref_cell,iVar14,nodes);
    if (RVar5 == 0) {
      uVar4 = ref_cell_part(ref_cell,local_f0,iVar14,&part);
      if (uVar4 != 0) {
        uVar18 = (ulong)uVar4;
        pcVar20 = "part";
        uVar11 = 0xc8e;
        goto LAB_00145ace;
      }
      if (ref_mpi->id == part) {
        ncell_local = ncell_local + 1;
      }
    }
  }
  ncell = ncell_local;
  RVar5 = 1;
  local_130 = ref_cell;
  uVar4 = ref_mpi_allsum(ref_mpi,&ncell,1,2);
  RVar3 = ncell;
  pFVar6 = local_138;
  if (uVar4 != 0) {
    uVar18 = (ulong)uVar4;
    pcVar20 = "sum";
    uVar11 = 0xc94;
    goto LAB_00145c8f;
  }
  if (0x7ffffffe < ncell) {
    pcVar20 = "requires version 4 solb for 64bit ncell";
    uVar11 = 0xc96;
LAB_00145ee8:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar11
           ,"ref_gather_scalar_cell_solb",pcVar20);
    return RVar5;
  }
  lVar13 = (long)ldim;
  if (ref_mpi->id == 0) {
    lVar7 = ftell(local_138);
    keyword_code = (int)local_118;
    sVar8 = fwrite(&keyword_code,4,1,pFVar6);
    if (sVar8 == 1) {
      sVar8 = lVar7 + RVar3 * (ldim * 8) + (long)(ldim * 4) + local_110 + 4;
      uVar4 = ref_export_meshb_next_position((FILE *)pFVar6,local_124,sVar8);
      if (uVar4 != 0) {
        uVar18 = (ulong)uVar4;
        pcVar20 = "next p";
        uVar11 = 0xc9e;
        goto LAB_00145c8f;
      }
      ncell_int = (REF_INT)ncell;
      local_f8 = sVar8;
      sVar8 = fwrite(&ncell_int,4,1,pFVar6);
      if (sVar8 == 1) {
        keyword_code = ldim;
        sVar8 = fwrite(&keyword_code,4,1,pFVar6);
        if (sVar8 == 1) {
          iVar14 = 0;
          if (0 < ldim) {
            iVar14 = ldim;
          }
          keyword_code = 1;
          iVar15 = iVar14 + 1;
          do {
            iVar15 = iVar15 + -1;
            if (iVar15 == 0) {
              if (ref_mpi->id != 0) goto LAB_00145df4;
              iVar15 = 0;
              goto LAB_00146516;
            }
            sVar8 = fwrite(&keyword_code,4,1,local_138);
          } while (sVar8 == 1);
          pcVar20 = "scalar";
          sStackY_160 = 1;
          uVar11 = 0xca5;
LAB_00145f1d:
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar11,"ref_gather_scalar_cell_solb",pcVar20,sStackY_160,sVar8);
          return 1;
        }
        pcVar20 = "n solutions";
        sStackY_160 = 1;
        uVar11 = 0xca2;
      }
      else {
        pcVar20 = "nnode";
        sStackY_160 = 1;
        uVar11 = 0xca0;
      }
    }
    else {
      pcVar20 = "keyword code";
      sStackY_160 = 1;
      uVar11 = 0xc9d;
    }
    goto LAB_00146182;
  }
LAB_00145df4:
  uVar4 = ref_mpi_gather_send(ref_mpi,&ncell_local,1,2);
  if (uVar4 != 0) {
    uVar18 = (ulong)uVar4;
    pcVar20 = "send ncell";
    uVar11 = 0xcc6;
LAB_00145c8f:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar11
           ,"ref_gather_scalar_cell_solb",uVar18,pcVar20);
    return (REF_STATUS)uVar18;
  }
  if (0 < ncell_local) {
    if (ncell_local * lVar13 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xcc8,"ref_gather_scalar_cell_solb","malloc data of REF_DBL negative");
      return 1;
    }
    local_118 = malloc(ncell_local * lVar13 * 8);
    if (local_118 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xcc8,"ref_gather_scalar_cell_solb","malloc data of REF_DBL NULL");
      return 2;
    }
    local_110 = 0;
    uVar18 = 0;
    if (0 < ldim) {
      uVar18 = (ulong)(uint)ldim;
    }
    for (iVar14 = 0; pvVar9 = local_118, pRVar2 = local_130, iVar14 < local_130->max;
        iVar14 = iVar14 + 1) {
      RVar5 = ref_cell_nodes(local_130,iVar14,nodes);
      if (RVar5 == 0) {
        uVar4 = ref_cell_part(pRVar2,local_f0,iVar14,&part);
        if (uVar4 != 0) {
          uVar18 = (ulong)uVar4;
          pcVar20 = "part";
          uVar11 = 0xccb;
          goto LAB_00145c8f;
        }
        if (ref_mpi->id == part) {
          for (uVar10 = 0; uVar10 != uVar18; uVar10 = uVar10 + 1) {
            uVar4 = local_130->node_per;
            uVar17 = 0;
            if (0 < (int)uVar4) {
              uVar17 = (ulong)uVar4;
            }
            dVar23 = 0.0;
            for (uVar19 = 0; uVar17 != uVar19; uVar19 = uVar19 + 1) {
              dVar23 = dVar23 + local_e8[uVar10 + nodes[uVar19] * lVar13];
            }
            *(double *)((long)local_118 + uVar10 * 8 + (long)((int)local_110 * ldim) * 8) =
                 dVar23 / (double)(int)uVar4;
          }
          local_110 = (ulong)((int)local_110 + 1);
        }
      }
    }
    uVar4 = ref_mpi_gather_send(ref_mpi,local_118,ldim * (int)ncell_local,3);
    if (uVar4 != 0) {
      uVar18 = (ulong)uVar4;
      pcVar20 = "send data";
      uVar11 = 0xcda;
      goto LAB_00145c8f;
    }
    free(pvVar9);
  }
  goto LAB_001463c8;
LAB_00146516:
  if (local_130->max <= iVar15) goto LAB_00146618;
  RVar5 = ref_cell_nodes(local_130,iVar15,nodes);
  if (RVar5 == 0) {
    uVar4 = ref_cell_part(local_130,local_f0,iVar15,&part);
    if (uVar4 != 0) {
      uVar18 = (ulong)uVar4;
      pcVar20 = "part";
      uVar11 = 0xcab;
      goto LAB_00145ace;
    }
    if (ref_mpi->id == part) {
      iVar16 = 0;
      while (iVar16 != iVar14) {
        uVar4 = local_130->node_per;
        uVar18 = 0;
        if (0 < (int)uVar4) {
          uVar18 = (ulong)uVar4;
        }
        local_c0 = 0.0;
        for (uVar10 = 0; uVar18 != uVar10; uVar10 = uVar10 + 1) {
          local_c0 = local_c0 + local_e8[nodes[uVar10] * ldim + iVar16];
        }
        local_c0 = local_c0 / (double)(int)uVar4;
        sVar8 = fwrite(&local_c0,8,1,local_138);
        iVar16 = iVar16 + 1;
        if (sVar8 != 1) {
          pcVar20 = "cell avg";
          sStackY_160 = 1;
          uVar11 = 0xcb2;
          goto LAB_00145f1d;
        }
      }
    }
  }
  iVar15 = iVar15 + 1;
  goto LAB_00146516;
LAB_00146618:
  for (iVar14 = 1; iVar14 < ref_mpi->n; iVar14 = iVar14 + 1) {
    uVar4 = ref_mpi_gather_recv(ref_mpi,&ncell_recv,1,2,iVar14);
    RVar3 = ncell_recv;
    if (uVar4 != 0) {
      uVar18 = (ulong)uVar4;
      pcVar20 = "recv ncell";
      uVar11 = 0xcb8;
      goto LAB_00145ace;
    }
    if (0 < ncell_recv) {
      if (ncell_recv * lVar13 < 0) {
        pcVar20 = "malloc data of REF_DBL negative";
        uVar11 = 0xcba;
        goto LAB_00145cc2;
      }
      pvVar9 = malloc(ncell_recv * lVar13 * 8);
      if (pvVar9 == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xcba,"ref_gather_scalar_cell_solb","malloc data of REF_DBL NULL");
        return 2;
      }
      uVar4 = ref_mpi_gather_recv(ref_mpi,pvVar9,(int)RVar3 * ldim,3,iVar14);
      if (uVar4 != 0) {
        uVar18 = (ulong)uVar4;
        pcVar20 = "send data";
        uVar11 = 0xcbd;
        goto LAB_00145ace;
      }
      sStackY_160 = ncell_recv * lVar13;
      sVar8 = fwrite(pvVar9,8,sStackY_160,local_138);
      if (sStackY_160 - sVar8 != 0) {
        pcVar20 = "worker cell avg";
        uVar11 = 0xcc0;
        goto LAB_00145f1d;
      }
      free(pvVar9);
    }
  }
LAB_001463c8:
  pRVar22 = local_120;
  pFVar6 = local_138;
  if (ref_mpi->id == 0) {
    sVar8 = ftell(local_138);
    if (local_f8 != sVar8) {
      pcVar20 = "solb metric record len inconsistent";
      uVar11 = 0xce0;
      sStackY_160 = local_f8;
LAB_00146182:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar11,"ref_gather_scalar_cell_solb",pcVar20,sStackY_160,sVar8);
      return 1;
    }
    if (ref_mpi->id == 0) {
      keyword_code = 0x36;
      sVar8 = fwrite(&keyword_code,4,1,pFVar6);
      if (sVar8 != 1) {
        pcVar20 = "end kw";
        sStackY_160 = 1;
        uVar11 = 0xce4;
        goto LAB_00146182;
      }
      uVar4 = ref_export_meshb_next_position((FILE *)pFVar6,local_124,0);
      pRVar22 = local_120;
      if (uVar4 != 0) {
        uVar18 = (ulong)uVar4;
        pcVar20 = "next p";
        uVar11 = 0xce6;
LAB_00145ace:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar11,"ref_gather_scalar_cell_solb",uVar18,pcVar20);
        return (REF_STATUS)uVar18;
      }
    }
  }
  if (pRVar22->mpi->id == 0) {
    fclose(pFVar6);
    return 0;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_gather_scalar_cell_solb(REF_GRID ref_grid, REF_INT ldim,
                                               REF_DBL *scalar,
                                               const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = NULL;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_LONG ncell_local, ncell, ntet, npri;
  int version, code, keyword_code, dim, cell_keyword;
  REF_INT i, header_size, ncell_int;
  REF_FILEPOS next_position;
  REF_INT part, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL cell_average, *data;
  REF_INT node, j, proc;
  REF_LONG ncell_recv;

  next_position = 0;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_cell_ncell(ref_grid_tet(ref_grid), ref_node, &ntet), "ntet");
  RSS(ref_cell_ncell(ref_grid_pri(ref_grid), ref_node, &npri), "npri");
  cell_keyword = REF_EMPTY;
  if (ntet > 0 && npri == 0) {
    /* GmfSolAtTetrahedra 113 - 47 = 66 */
    cell_keyword = 66;
    ref_cell = ref_grid_tet(ref_grid);
  }
  if (ntet == 0 && npri > 0) {
    /* GmfSolAtTetrahedra 114 - 47 = 67 */
    cell_keyword = 67;
    ref_cell = ref_grid_pri(ref_grid);
  }
  RUS(REF_EMPTY, cell_keyword, "grid must be all tet or all prism");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
  }

  if (REF_EXPORT_MESHB_VERTEX_3 < ntet + npri) {
    version = 3;
    header_size = 4 + 8 + 4;
  } else {
    version = 2;
    header_size = 4 + 4 + 4;
  }

  if (ref_mpi_once(ref_mpi)) {
    code = 1;
    REIS(1, fwrite(&code, sizeof(int), 1, file), "code");
    REIS(1, fwrite(&version, sizeof(int), 1, file), "version");
    next_position = (REF_FILEPOS)header_size + ftell(file);
    keyword_code = 3;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "dim code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    dim = 3;
    REIS(1, fwrite(&dim, sizeof(int), 1, file), "dim");
    REIS(next_position, ftell(file), "dim inconsistent");
  }

  ncell_local = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
    if (ref_mpi_rank(ref_mpi) == part) {
      ncell_local++;
    }
  }
  ncell = ncell_local;
  RSS(ref_mpi_allsum(ref_mpi, &ncell, 1, REF_LONG_TYPE), "sum");

  RAS(ncell < (REF_LONG)REF_INT_MAX, "requires version 4 solb for 64bit ncell");

  if (ref_mpi_once(ref_mpi)) {
    next_position = (REF_FILEPOS)header_size + (REF_FILEPOS)(4 + (ldim * 4)) +
                    (REF_FILEPOS)ncell * (REF_FILEPOS)(ldim * 8) + ftell(file);
    /* GmfSolAtTetrahedra 113 - 47 = 66 */
    keyword_code = cell_keyword;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    ncell_int = (int)ncell;
    REIS(1, fwrite(&ncell_int, sizeof(int), 1, file), "nnode");
    keyword_code = ldim; /* one solution at node */
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "n solutions");
    keyword_code = 1; /* solution type 1, scalar */
    for (i = 0; i < ldim; i++) {
      REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "scalar");
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (i = 0; i < ldim; i++) {
          cell_average = 0.0;
          for (node = 0; node < ref_cell_node_per(ref_cell); node++)
            cell_average += scalar[i + ldim * nodes[node]];
          cell_average /= (REF_DBL)ref_cell_node_per(ref_cell);
          REIS(1, fwrite(&cell_average, sizeof(REF_DBL), 1, file), "cell avg");
        }
      }
    }
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell_recv, 1, REF_LONG_TYPE, proc),
          "recv ncell");
      if (ncell_recv > 0) {
        ref_malloc(data, ldim * ncell_recv, REF_DBL);
        RSS(ref_mpi_gather_recv(ref_mpi, data, (REF_INT)(ldim * ncell_recv),
                                REF_DBL_TYPE, proc),
            "send data");
        REIS((size_t)(ldim * ncell_recv),
             fwrite(data, sizeof(REF_DBL), (size_t)(ldim * ncell_recv), file),
             "worker cell avg");
        ref_free(data);
      }
    }
  } else {
    RSS(ref_mpi_gather_send(ref_mpi, &ncell_local, 1, REF_LONG_TYPE),
        "send ncell");
    if (ncell_local > 0) {
      ref_malloc(data, ldim * ncell_local, REF_DBL);
      j = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) {
          for (i = 0; i < ldim; i++) {
            cell_average = 0.0;
            for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
              cell_average += scalar[i + ldim * nodes[node]];
            }
            cell_average /= (REF_DBL)ref_cell_node_per(ref_cell);
            data[i + ldim * j] = cell_average;
          }
          j++;
        }
      }
      RSS(ref_mpi_gather_send(ref_mpi, data, (REF_INT)(ldim * ncell_local),
                              REF_DBL_TYPE),
          "send data");
      ref_free(data);
    }
  }

  if (ref_mpi_once(ref_mpi))
    REIS(next_position, ftell(file), "solb metric record len inconsistent");

  if (ref_mpi_once(ref_mpi)) { /* End */
    keyword_code = 54;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "end kw");
    next_position = 0;
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
  }

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}